

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

__pid_t __thiscall kj::_::NeverDone::wait(NeverDone *this,void *__stat_loc)

{
  SourceLocation location;
  OwnPromiseNode node;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  ExceptionOr<kj::_::Void> dummy;
  OwnPromiseNode local_1c0;
  ExceptionOrValue local_1b8;
  undefined1 local_20;
  
  local_1b8.exception.ptr.isSet = false;
  local_20 = 0;
  neverDone();
  location.function = (char *)in_stack_00000010;
  location.fileName = (char *)in_stack_00000008;
  location._16_8_ = in_stack_00000018;
  waitImpl(&local_1c0,&local_1b8,(WaitScope *)__stat_loc,location);
  node.ptr = local_1c0.ptr;
  if (&(local_1c0.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_1c0.ptr = (PromiseNode *)0x0;
    PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  unreachable();
}

Assistant:

void NeverDone::wait(WaitScope& waitScope, SourceLocation location) const {
  ExceptionOr<Void> dummy;
  waitImpl(neverDone(), dummy, waitScope, location);
  KJ_UNREACHABLE;
}